

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormatSymbols::DecimalFormatSymbols(DecimalFormatSymbols *this)

{
  Locale *other;
  UnicodeString *local_88;
  UnicodeString *local_68;
  UnicodeString *local_28;
  DecimalFormatSymbols *this_local;
  
  memset(this,0,8);
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DecimalFormatSymbols_004e0720;
  local_28 = (UnicodeString *)&this->field_0x8;
  do {
    UnicodeString::UnicodeString(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != &this->fNoSymbol);
  UnicodeString::UnicodeString(&this->fNoSymbol);
  other = Locale::getRoot();
  Locale::Locale(&this->locale,other);
  this->currPattern = (char16_t *)0x0;
  local_68 = (UnicodeString *)&this->field_0x978;
  do {
    UnicodeString::UnicodeString(local_68);
    local_68 = local_68 + 1;
  } while (local_68 != (UnicodeString *)&this->field_0xa38);
  local_88 = (UnicodeString *)&this->field_0xa38;
  do {
    UnicodeString::UnicodeString(local_88);
    local_88 = local_88 + 1;
  } while (local_88 != (UnicodeString *)&this->fIsCustomCurrencySymbol);
  this->actualLocale[0] = '\0';
  this->validLocale[0] = '\0';
  initialize(this);
  return;
}

Assistant:

DecimalFormatSymbols::DecimalFormatSymbols()
        : UObject(), locale(Locale::getRoot()), currPattern(NULL) {
    *validLocale = *actualLocale = 0;
    initialize();
}